

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O0

int __thiscall
soul::Optimisations::Inliner::clone
          (Inliner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *this_00;
  Function *pFVar1;
  ArgListType *this_01;
  Expression *pEVar2;
  pool_ref<soul::heart::Expression> local_68;
  pool_ref<soul::heart::Expression> *local_60;
  pool_ref<soul::heart::Expression> *arg;
  pool_ref<soul::heart::Expression> *__end2;
  pool_ref<soul::heart::Expression> *__begin2;
  ArgListType *__range2;
  pool_ptr<soul::heart::Expression> local_30;
  Function *local_20;
  FunctionCall *fc;
  FunctionCall *old_local;
  Inliner *this_local;
  
  this_00 = this->module;
  local_30.object = *(Expression **)(__fn + 0x20);
  fc = (FunctionCall *)__fn;
  old_local = (FunctionCall *)this;
  cloneExpressionPtr((Inliner *)&stack0xffffffffffffffd8,(pool_ptr<soul::heart::Expression> *)this);
  pFVar1 = heart::FunctionCall::getFunction(fc);
  pFVar1 = (Function *)
           Module::
           allocate<soul::heart::FunctionCall,soul::CodeLocation_const&,soul::pool_ptr<soul::heart::Expression>,soul::heart::Function&>
                     (this_00,(CodeLocation *)(__fn + 8),
                      (pool_ptr<soul::heart::Expression> *)&stack0xffffffffffffffd8,pFVar1);
  pool_ptr<soul::heart::Expression>::~pool_ptr
            ((pool_ptr<soul::heart::Expression> *)&stack0xffffffffffffffd8);
  pool_ptr<soul::heart::Expression>::~pool_ptr(&local_30);
  __begin2 = (pool_ref<soul::heart::Expression> *)&fc->arguments;
  local_20 = pFVar1;
  __end2 = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::begin
                     ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
                      __begin2);
  arg = ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::end
                  ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)__begin2)
  ;
  for (; __end2 != arg; __end2 = __end2 + 1) {
    local_60 = __end2;
    this_01 = (ArgListType *)&local_20->name;
    pEVar2 = pool_ref::operator_cast_to_Expression_((pool_ref *)__end2);
    pEVar2 = cloneExpression(this,pEVar2);
    pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>(&local_68,pEVar2);
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              (this_01,&local_68);
    pool_ref<soul::heart::Expression>::~pool_ref(&local_68);
  }
  return (int)local_20;
}

Assistant:

heart::FunctionCall& clone (const heart::FunctionCall& old)
        {
            auto& fc = module.allocate<heart::FunctionCall> (old.location, cloneExpressionPtr (old.target), old.getFunction());

            for (auto& arg : old.arguments)
                fc.arguments.push_back (cloneExpression (arg));

            return fc;
        }